

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCallArgument.cpp
# Opt level: O1

string * __thiscall
ninx::parser::element::FunctionCallArgument::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCallArgument *this,int level)

{
  size_type *psVar1;
  Expression *pEVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  string _name;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"<implicit>","");
  if ((this->name)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::_M_assign((string *)local_70);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)level);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
  local_b0 = &local_a0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar4[3];
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70[0]);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_e0 = *puVar7;
    uStack_d8 = (undefined4)plVar4[3];
    uStack_d4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pEVar2 = (this->value)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar2->super_Statement).super_ASTElement + 0x18))
            (&local_d0,pEVar2,level + 1);
  uVar8 = 0xf;
  if (local_f0 != &local_e0) {
    uVar8 = local_e0;
  }
  if (uVar8 < (ulong)(local_c8 + local_e8)) {
    uVar8 = 0xf;
    if (local_d0 != local_c0) {
      uVar8 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_e8) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0015309b;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
LAB_0015309b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionCallArgument::dump(int level) const {
    std::string _name {"<implicit>"};
    if (this->name) {
        _name = *(this->name);
    }
    return std::string(level, '\t')+ "FunctionCallArgument: "+_name + " = "+ this->value->dump(level+1);
}